

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_geometric.cpp
# Opt level: O0

Vector __thiscall Vector::ProjectPlane(Vector *this,Vector *right,Vector *up)

{
  float x;
  float y;
  float z;
  Vector VVar1;
  undefined1 auStack_68 [8];
  Vector t2;
  Vector t1;
  undefined1 local_40 [8];
  Vector src;
  Vector *up_local;
  Vector *right_local;
  Vector *this_local;
  
  src._8_8_ = up;
  x = X(this);
  y = Y(this);
  z = Z(this);
  Vector((Vector *)local_40,x,y,z);
  Vector((Vector *)(t2.m_vec + 2));
  Vector((Vector *)auStack_68);
  VVar1 = ProjectVector((Vector *)local_40,right);
  t2._8_8_ = VVar1.m_vec._0_8_;
  VVar1 = ProjectVector((Vector *)local_40,(Vector *)src._8_8_);
  t2.m_vec._0_8_ = VVar1._8_8_;
  auStack_68 = VVar1.m_vec._0_8_;
  VVar1 = operator+((Vector *)(t2.m_vec + 2),(Vector *)auStack_68);
  return VVar1;
}

Assistant:

Vector Vector::ProjectPlane(Vector &right, Vector &up)
{
   Vector src(X(), Y(), Z());
   Vector t1, t2;

   t1 = src.ProjectVector(right);
   t2 = src.ProjectVector(up);

   return t1 + t2;
}